

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_adapt
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *adaptor_secret32,
              uchar *adaptor_sig65)

{
  int iVar1;
  undefined1 local_d8 [4];
  int high;
  uchar buf32 [32];
  undefined1 local_b0 [4];
  int overflow;
  secp256k1_scalar sigr;
  secp256k1_scalar s;
  secp256k1_scalar sp;
  secp256k1_scalar adaptor_secret;
  uchar *adaptor_sig65_local;
  uchar *adaptor_secret32_local;
  secp256k1_ecdsa_signature *sig_local;
  secp256k1_context *ctx_local;
  
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (adaptor_secret32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_secret32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_sig65 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_set_b32((secp256k1_scalar *)(sp.d + 3),adaptor_secret32,(int *)(buf32 + 0x1c));
    if (buf32._28_4_ == 0) {
      iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                        ((secp256k1_ge *)0x0,(secp256k1_scalar *)local_b0,
                         (secp256k1_scalar *)(s.d + 3),adaptor_sig65);
      if (iVar1 == 0) {
        secp256k1_scalar_clear((secp256k1_scalar *)(sp.d + 3));
        ctx_local._4_4_ = 0;
      }
      else {
        secp256k1_scalar_inverse((secp256k1_scalar *)(sigr.d + 3),(secp256k1_scalar *)(sp.d + 3));
        secp256k1_scalar_mul
                  ((secp256k1_scalar *)(sigr.d + 3),(secp256k1_scalar *)(sigr.d + 3),
                   (secp256k1_scalar *)(s.d + 3));
        iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)(sigr.d + 3));
        secp256k1_scalar_cond_negate((secp256k1_scalar *)(sigr.d + 3),iVar1);
        secp256k1_ecdsa_signature_save
                  (sig,(secp256k1_scalar *)local_b0,(secp256k1_scalar *)(sigr.d + 3));
        memset(local_d8,0,0x20);
        secp256k1_scalar_clear((secp256k1_scalar *)(sp.d + 3));
        secp256k1_scalar_clear((secp256k1_scalar *)(s.d + 3));
        secp256k1_scalar_clear((secp256k1_scalar *)(sigr.d + 3));
        ctx_local._4_4_ = 1;
      }
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_adaptor_adapt(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sig, const unsigned char *adaptor_secret32, const unsigned char *adaptor_sig65) {
    secp256k1_scalar adaptor_secret;
    secp256k1_scalar sp;
    secp256k1_scalar s;
    secp256k1_scalar sigr;
    int overflow;
    unsigned char buf32[32];
    int high;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(adaptor_secret32 != NULL);
    ARG_CHECK(adaptor_sig65 != NULL);

    secp256k1_scalar_set_b32(&adaptor_secret, adaptor_secret32, &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &sigr, &sp, adaptor_sig65)) {
        secp256k1_scalar_clear(&adaptor_secret);
        return 0;
    }
    secp256k1_scalar_inverse(&s, &adaptor_secret);
    secp256k1_scalar_mul(&s, &s, &sp);
    high = secp256k1_scalar_is_high(&s);
    secp256k1_scalar_cond_negate(&s, high);

    secp256k1_ecdsa_signature_save(sig, &sigr, &s);

    memset(buf32, 0, sizeof(buf32));
    secp256k1_scalar_clear(&adaptor_secret);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return 1;
}